

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.cc
# Opt level: O0

VariableIndex __thiscall
cnn::ComputationGraph::add_input
          (ComputationGraph *this,Dim *d,vector<float,_std::allocator<float>_> *pm)

{
  size_type sVar1;
  Dim *d_00;
  vector<cnn::Node_*,_std::allocator<cnn::Node_*>_> *in_RSI;
  vector<float,_std::allocator<float>_> *in_RDI;
  VariableIndex *new_node_index;
  uint uVar2;
  vector<float,_std::allocator<float>_> *dat;
  InputNode *in_stack_ffffffffffffffc0;
  uint local_24 [9];
  
  dat = in_RDI;
  sVar1 = std::vector<cnn::Node_*,_std::allocator<cnn::Node_*>_>::size(in_RSI);
  local_24[0] = (uint)sVar1;
  VariableIndex::VariableIndex((VariableIndex *)dat,local_24);
  d_00 = (Dim *)operator_new(0x98);
  InputNode::InputNode(in_stack_ffffffffffffffc0,d_00,dat);
  std::vector<cnn::Node_*,_std::allocator<cnn::Node_*>_>::push_back(in_RSI,(value_type *)in_RDI);
  uVar2 = (uint)in_RDI;
  set_dim_for_new_node((ComputationGraph *)d,(VariableIndex *)pm);
  return (VariableIndex)uVar2;
}

Assistant:

VariableIndex ComputationGraph::add_input(const Dim& d, const vector<float>& pm) {
  VariableIndex new_node_index(nodes.size());
  nodes.push_back(new InputNode(d, pm));
  set_dim_for_new_node(new_node_index);
  return new_node_index;
}